

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

void __thiscall QMessageBoxPrivate::QMessageBoxPrivate(QMessageBoxPrivate *this)

{
  QDialogPrivate::QDialogPrivate(&this->super_QDialogPrivate);
  *(undefined ***)&(this->super_QDialogPrivate).super_QWidgetPrivate =
       &PTR__QMessageBoxPrivate_007deb00;
  (this->customButtonList).d.d = (Data *)0x0;
  (this->customButtonList).d.ptr = (QAbstractButton **)0x0;
  (this->customButtonList).d.size = 0;
  this->escapeButton = (QAbstractButton *)0x0;
  this->defaultButton = (QPushButton *)0x0;
  this->checkbox = (QCheckBox *)0x0;
  this->clickedButton = (QAbstractButton *)0x0;
  this->detailsButton = (DetailButton *)0x0;
  *(undefined8 *)((long)&this->detailsButton + 1) = 0;
  *(undefined8 *)((long)&this->detailsText + 1) = 0;
  this->autoAddOkButton = true;
  this->detectedEscapeButton = (QAbstractButton *)0x0;
  this->informativeLabel = (QLabel *)0x0;
  (this->receiverToDisconnectOnClose).wp.d = (Data *)0x0;
  (this->receiverToDisconnectOnClose).wp.value = (QObject *)0x0;
  (this->memberToDisconnectOnClose).d.d = (Data *)0x0;
  (this->memberToDisconnectOnClose).d.ptr = (char *)0x0;
  (this->memberToDisconnectOnClose).d.size = 0;
  (this->signalToDisconnectOnClose).d.d = (Data *)0x0;
  (this->signalToDisconnectOnClose).d.ptr = (char *)0x0;
  (this->signalToDisconnectOnClose).d.size = 0;
  QMessageDialogOptions::create();
  return;
}

Assistant:

QMessageBoxPrivate() : escapeButton(nullptr), defaultButton(nullptr), checkbox(nullptr), clickedButton(nullptr), detailsButton(nullptr),
#if QT_CONFIG(textedit)
                           detailsText(nullptr),
#endif
                           compatMode(false), autoAddOkButton(true),
                           detectedEscapeButton(nullptr), informativeLabel(nullptr),
                           options(QMessageDialogOptions::create()) { }